

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>::
~CartesianProductGenerator
          (CartesianProductGenerator<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int> *this)

{
  ParamGeneratorInterface<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>_> *in_RDI;
  
  in_RDI->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_01f93690;
  std::
  tuple<testing::internal::ParamGenerator<void_(*)(int_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>,_testing::internal::ParamGenerator<int>_>
  ::~tuple((tuple<testing::internal::ParamGenerator<void_(*)(int_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>,_testing::internal::ParamGenerator<int>_>
            *)0xa08cda);
  ParamGeneratorInterface<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>_>::
  ~ParamGeneratorInterface(in_RDI);
  return;
}

Assistant:

~CartesianProductGenerator() override {}